

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsLongStressCase.cpp
# Opt level: O0

void __thiscall
deqp::gls::LongStressCase::LongStressCase
          (LongStressCase *this,TestContext *testCtx,RenderContext *renderCtx,char *name,char *desc,
          int maxTexMemoryUsageBytes,int maxBufMemoryUsageBytes,int numDrawCallsPerIteration,
          int numTrianglesPerDrawCall,
          vector<deqp::gls::ProgramContext,_std::allocator<deqp::gls::ProgramContext>_>
          *programContexts,FeatureProbabilities *probabilities,deUint32 indexBufferUsage,
          deUint32 attrBufferUsage,int redundantBufferFactor,bool showDebugInfo)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  bool bVar16;
  int iVar17;
  ContextType ctxType;
  ApiType requiredApiType;
  deUint32 dVar18;
  uint uVar19;
  char *str;
  CommandLine *this_00;
  bool showDebugInfo_local;
  int maxTexMemoryUsageBytes_local;
  char *desc_local;
  char *name_local;
  RenderContext *renderCtx_local;
  TestContext *testCtx_local;
  LongStressCase *this_local;
  
  tcu::TestCase::TestCase(&this->super_TestCase,testCtx,name,desc);
  (this->super_TestCase).super_TestNode._vptr_TestNode = (_func_int **)&PTR__LongStressCase_00cbaae0
  ;
  this->m_renderCtx = renderCtx;
  this->m_maxTexMemoryUsageBytes = maxTexMemoryUsageBytes;
  this->m_maxBufMemoryUsageBytes = maxBufMemoryUsageBytes;
  this->m_numDrawCallsPerIteration = numDrawCallsPerIteration;
  this->m_numTrianglesPerDrawCall = numTrianglesPerDrawCall;
  this->m_numVerticesPerDrawCall = numTrianglesPerDrawCall + 2;
  std::vector<deqp::gls::ProgramContext,_std::allocator<deqp::gls::ProgramContext>_>::vector
            (&this->m_programContexts,programContexts);
  fVar12 = probabilities->rebuildProgram;
  fVar13 = probabilities->reuploadTexture;
  fVar14 = probabilities->reuploadBuffer;
  fVar15 = probabilities->reuploadWithTexImage;
  fVar8 = probabilities->reuploadWithBufferData;
  fVar9 = probabilities->deleteTexture;
  fVar10 = probabilities->deleteBuffer;
  fVar11 = probabilities->wastefulTextureMemoryUsage;
  fVar4 = probabilities->wastefulBufferMemoryUsage;
  fVar5 = probabilities->clientMemoryAttributeData;
  fVar6 = probabilities->clientMemoryIndexData;
  fVar7 = probabilities->randomBufferUploadTarget;
  fVar1 = probabilities->randomBufferUsage;
  fVar2 = probabilities->useDrawArrays;
  fVar3 = probabilities->separateAttributeBuffers;
  (this->m_probabilities).randomBufferUploadTarget = probabilities->randomBufferUploadTarget;
  (this->m_probabilities).randomBufferUsage = fVar1;
  (this->m_probabilities).useDrawArrays = fVar2;
  (this->m_probabilities).separateAttributeBuffers = fVar3;
  (this->m_probabilities).wastefulBufferMemoryUsage = fVar4;
  (this->m_probabilities).clientMemoryAttributeData = fVar5;
  (this->m_probabilities).clientMemoryIndexData = fVar6;
  (this->m_probabilities).randomBufferUploadTarget = fVar7;
  (this->m_probabilities).reuploadWithBufferData = fVar8;
  (this->m_probabilities).deleteTexture = fVar9;
  (this->m_probabilities).deleteBuffer = fVar10;
  (this->m_probabilities).wastefulTextureMemoryUsage = fVar11;
  (this->m_probabilities).rebuildProgram = fVar12;
  (this->m_probabilities).reuploadTexture = fVar13;
  (this->m_probabilities).reuploadBuffer = fVar14;
  (this->m_probabilities).reuploadWithTexImage = fVar15;
  this->m_indexBufferUsage = indexBufferUsage;
  this->m_attrBufferUsage = attrBufferUsage;
  this->m_redundantBufferFactor = redundantBufferFactor;
  this->m_showDebugInfo = showDebugInfo;
  iVar17 = getNumIterations(testCtx,5);
  this->m_numIterations = iVar17;
  ctxType.super_ApiType.m_bits = (ApiType)(*renderCtx->_vptr_RenderContext[2])();
  requiredApiType = glu::ApiType::es(3,0);
  bVar16 = glu::contextSupports(ctxType,requiredApiType);
  this->m_isGLES3 = bVar16;
  this->m_currentIteration = 0;
  this->m_startTimeSeconds = 0xffffffffffffffff;
  this->m_lastLogTime = 0xffffffffffffffff;
  this->m_lastLogIteration = 0;
  this->m_currentLogEntryNdx = 0;
  str = tcu::TestNode::getName((TestNode *)this);
  dVar18 = deStringHash(str);
  this_00 = tcu::TestContext::getCommandLine(testCtx);
  uVar19 = tcu::CommandLine::getBaseSeed(this_00);
  de::Random::Random(&this->m_rnd,dVar18 ^ uVar19);
  this->m_programs = (GLObjectManager<deqp::gls::LongStressCaseInternal::Program> *)0x0;
  this->m_buffers = (GLObjectManager<deqp::gls::LongStressCaseInternal::Buffer> *)0x0;
  this->m_textures = (GLObjectManager<deqp::gls::LongStressCaseInternal::Texture> *)0x0;
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::vector(&this->m_vertexIndices);
  std::
  vector<deqp::gls::LongStressCase::ProgramResources,_std::allocator<deqp::gls::LongStressCase::ProgramResources>_>
  ::vector(&this->m_programResources);
  this->m_debugInfoRenderer = (DebugInfoRenderer *)0x0;
  return;
}

Assistant:

LongStressCase::LongStressCase (tcu::TestContext&				testCtx,
								const glu::RenderContext&		renderCtx,
								const char* const				name,
								const char* const				desc,
								const int						maxTexMemoryUsageBytes,
								const int						maxBufMemoryUsageBytes,
								const int						numDrawCallsPerIteration,
								const int						numTrianglesPerDrawCall,
								const vector<ProgramContext>&	programContexts,
								const FeatureProbabilities&		probabilities,
								const deUint32					indexBufferUsage,
								const deUint32					attrBufferUsage,
								const int						redundantBufferFactor,
								const bool						showDebugInfo)
	: tcu::TestCase					(testCtx, name, desc)
	, m_renderCtx					(renderCtx)
	, m_maxTexMemoryUsageBytes		(maxTexMemoryUsageBytes)
	, m_maxBufMemoryUsageBytes		(maxBufMemoryUsageBytes)
	, m_numDrawCallsPerIteration	(numDrawCallsPerIteration)
	, m_numTrianglesPerDrawCall		(numTrianglesPerDrawCall)
	, m_numVerticesPerDrawCall		(numTrianglesPerDrawCall+2) // \note Triangle strips are used.
	, m_programContexts				(programContexts)
	, m_probabilities				(probabilities)
	, m_indexBufferUsage			(indexBufferUsage)
	, m_attrBufferUsage				(attrBufferUsage)
	, m_redundantBufferFactor		(redundantBufferFactor)
	, m_showDebugInfo				(showDebugInfo)
	, m_numIterations				(getNumIterations(testCtx, 5))
	, m_isGLES3						(contextSupports(renderCtx.getType(), glu::ApiType::es(3,0)))
	, m_currentIteration			(0)
	, m_startTimeSeconds			((deUint64)-1)
	, m_lastLogTime					((deUint64)-1)
	, m_lastLogIteration			(0)
	, m_currentLogEntryNdx			(0)
	, m_rnd							(deStringHash(getName()) ^ testCtx.getCommandLine().getBaseSeed())
	, m_programs					(DE_NULL)
	, m_buffers						(DE_NULL)
	, m_textures					(DE_NULL)
	, m_debugInfoRenderer			(DE_NULL)
{
	DE_ASSERT(m_numVerticesPerDrawCall <= (int)std::numeric_limits<deUint16>::max()+1); // \note Vertices are referred to with 16-bit indices.
	DE_ASSERT(m_redundantBufferFactor > 0);
}